

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void Parser::
     MapBindIdentifierFromElement<Emit(ParseNode*,ByteCodeGenerator*,FuncInfo*,int,bool,bool)::__1>
               (ParseNodePtr elementNode,anon_class_8_1_36764579 handler)

{
  OpCode OVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  ParseNodeBin *pPVar5;
  ParseNodeVar *pPVar6;
  undefined4 *puVar7;
  RegSlot location;
  
  if (elementNode->nop == knopEllipsis) {
    pPVar5 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
  }
  else {
    if (elementNode->nop != knopAsg) goto LAB_00826c97;
    pPVar5 = ParseNode::AsParseNodeBin(elementNode);
  }
  elementNode = pPVar5->pnode1;
LAB_00826c97:
  OVar1 = elementNode->nop;
  if ((OVar1 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<Emit(ParseNode*,ByteCodeGenerator*,FuncInfo*,int,bool,bool)::__1>
              (elementNode,handler);
    return;
  }
  if ((byte)(OVar1 + ~knopList) < 3) {
    pPVar6 = ParseNode::AsParseNodeVar(elementNode);
    uVar2 = pPVar6->sym->location;
    location = 0xfffffffe;
    if (uVar2 < 0xfffffffe) {
      location = uVar2;
    }
    pPVar6 = ParseNode::AsParseNodeVar(elementNode);
    Emit::anon_class_40_5_5e59db1e::operator()
              (handler.ParamTrackAndInitialization,pPVar6->sym,false,location);
    return;
  }
  if (OVar1 != knopEmpty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }